

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts3OffsetsFunc(sqlite3_context *pContext,int nVal,sqlite3_value **apVal)

{
  uint uVar1;
  sqlite3_vtab *psVar2;
  long lVar3;
  sqlite3_stmt *pStmt;
  int iVar4;
  uchar *z;
  char **ppcVar5;
  Mem *pMVar6;
  ulong uVar7;
  char *z_00;
  code *xDel;
  uint uVar8;
  char **pp;
  undefined8 uVar9;
  int iVar10;
  long lVar11;
  int iCurrent;
  int iEnd;
  int iStart;
  int NDUMMY;
  int iPhrase;
  TermOffsetCtx sCtx;
  StrBuffer res;
  Fts3Cursor *pCsr;
  char *ZDUMMY;
  int local_108;
  int local_104;
  int local_100;
  uint local_fc;
  sqlite3_vtab *local_f8;
  undefined4 local_ec;
  undefined8 local_e8;
  uint local_dc;
  Fts3Cursor *local_d8;
  ulong uStack_d0;
  sqlite3_int64 local_c8;
  char **ppcStack_c0;
  StrBuffer local_b8;
  long local_a0;
  ulong local_98;
  ulong local_90;
  Fts3Cursor *local_88;
  undefined1 local_80 [8];
  Fts3Cursor *local_78;
  undefined8 local_70;
  
  iVar4 = fts3FunctionArg(pContext,"offsets",*apVal,&local_88);
  if (iVar4 != 0) {
    return;
  }
  iVar4 = fts3CursorSeek(pContext,local_88);
  if (iVar4 != 0) {
    return;
  }
  psVar2 = (local_88->base).pVtab;
  lVar3 = *(long *)psVar2[3].pModule;
  local_b8.z = (char *)0x0;
  local_b8.n = 0;
  local_b8.nAlloc = 0;
  if (local_88->pExpr == (Fts3Expr *)0x0) {
    z_00 = "";
    iVar4 = 0;
    xDel = (_func_void_void_ptr *)0x0;
    goto LAB_001db480;
  }
  local_c8 = 0;
  ppcStack_c0 = (char **)0x0;
  local_d8 = (Fts3Cursor *)0x0;
  uStack_d0 = 0;
  local_70 = 0;
  local_78 = local_88;
  local_e8._0_4_ = 0;
  local_f8 = psVar2;
  local_108 = fts3ExprIterate2(local_88->pExpr,(int *)&local_e8,fts3ExprLoadDoclistsCb,&local_78);
  if (local_108 == 0) {
    uVar8 = local_70._4_4_;
    lVar11 = (long)(int)local_70._4_4_;
    iVar4 = sqlite3_initialize();
    if (iVar4 == 0) {
      ppcStack_c0 = (char **)sqlite3Malloc(lVar11 << 4);
      if (ppcStack_c0 != (char **)0x0) {
        local_c8 = local_88->iPrevId;
        local_d8 = local_88;
        if (*(int *)&local_f8[2].pModule < 1) {
          local_108 = 0;
          local_d8 = local_88;
        }
        else {
          local_98 = (ulong)uVar8;
          uVar7 = 0;
          local_a0 = lVar11;
          do {
            local_ec = 0;
            local_fc = 0;
            local_100 = 0;
            local_104 = 0;
            local_78 = (Fts3Cursor *)((ulong)local_78 & 0xffffffff00000000);
            uStack_d0 = uVar7;
            fts3ExprIterate2(local_88->pExpr,(int *)&local_78,fts3ExprTermOffsetInit,&local_d8);
            uVar8 = (int)uVar7 + 1;
            z = sqlite3_column_text(local_88->pStmt,uVar8);
            iVar4 = sqlite3_column_bytes(local_88->pStmt,uVar8);
            if (z == (uchar *)0x0) {
              pStmt = local_88->pStmt;
              pMVar6 = columnMem(pStmt,uVar8);
              uVar1._0_2_ = pMVar6->flags;
              uVar1._2_1_ = pMVar6->enc;
              uVar1._3_1_ = pMVar6->eSubtype;
              columnMallocFailure(pStmt);
              if ((0xaaaaaaaaU >> (uVar1 & 0x1f) & 1) == 0) {
                local_108 = 7;
                break;
              }
            }
            else {
              local_dc = uVar8;
              local_108 = sqlite3Fts3OpenTokenizer
                                    ((sqlite3_tokenizer *)local_f8[3].pModule,local_88->iLangid,
                                     (char *)z,iVar4,(sqlite3_tokenizer_cursor **)&local_e8);
              if (local_108 != 0) break;
              uVar9 = CONCAT44(local_e8._4_4_,(int)local_e8);
              local_90 = uVar7;
              local_108 = (**(code **)(lVar3 + 0x28))
                                    (uVar9,local_80,&local_ec,&local_fc,&local_100,&local_104);
              if (local_108 == 0) {
                if ((int)local_a0 < 1) {
                  local_108 = 0x65;
                  iVar4 = local_108;
                }
                else {
                  local_108 = 0x65;
                  do {
                    iVar10 = 0x7fffffff;
                    pp = (char **)0x0;
                    ppcVar5 = ppcStack_c0;
                    uVar7 = local_98;
                    do {
                      if ((*ppcVar5 != (char *)0x0) &&
                         (iVar4 = *(int *)(ppcVar5 + 1) - *(int *)((long)ppcVar5 + 0xc),
                         iVar4 < iVar10)) {
                        pp = ppcVar5;
                        iVar10 = iVar4;
                      }
                      ppcVar5 = ppcVar5 + 2;
                      uVar7 = uVar7 - 1;
                    } while (uVar7 != 0);
                    iVar4 = local_108;
                    if (pp == (char **)0x0) break;
                    if ((byte)**pp < 2) {
                      *pp = (char *)0x0;
                    }
                    else {
                      fts3GetDeltaPosition(pp,(int *)(pp + 1));
                    }
                    if (local_104 < iVar10) {
                      uVar9 = CONCAT44(local_e8._4_4_,(int)local_e8);
                      do {
                        iVar4 = (**(code **)(lVar3 + 0x28))
                                          (uVar9,local_80,&local_ec,&local_fc,&local_100,&local_104)
                        ;
                        if (iVar4 != 0) break;
                      } while (local_104 < iVar10);
                      if (iVar4 != 0) {
                        if (iVar4 == 0x65) {
                          iVar4 = 0x65;
                          if (*(long *)&local_f8[3].nRef == 0) {
                            iVar4 = 0x10b;
                          }
                        }
                        break;
                      }
                    }
                    sqlite3_snprintf(0x40,(char *)&local_78,"%d %d %d %d ",local_90,
                                     (long)pp - (long)ppcStack_c0 >> 4,(ulong)local_fc,
                                     local_100 - local_fc);
                    iVar4 = fts3StringAppend(&local_b8,(char *)&local_78,-1);
                  } while (iVar4 == 0);
                }
                local_108 = iVar4;
                uVar9 = CONCAT44(local_e8._4_4_,(int)local_e8);
              }
              (**(code **)(lVar3 + 0x20))(uVar9);
              uVar8 = local_dc;
              if (local_108 != 0x65) break;
            }
            uVar7 = (ulong)uVar8;
            local_108 = 0;
          } while ((int)uVar8 < *(int *)&local_f8[2].pModule);
        }
        goto LAB_001db40e;
      }
    }
    else {
      ppcStack_c0 = (char **)0x0;
    }
    local_108 = 7;
  }
LAB_001db40e:
  sqlite3_free(ppcStack_c0);
  psVar2 = local_f8;
  sqlite3_blob_close((sqlite3_blob *)local_f8[0x13].zErrMsg);
  psVar2[0x13].zErrMsg = (char *)0x0;
  if (local_108 != 0) {
    sqlite3_result_error_code(pContext,local_108);
    sqlite3_free(local_b8.z);
    return;
  }
  iVar4 = local_b8.n + -1;
  xDel = sqlite3_free;
  z_00 = local_b8.z;
LAB_001db480:
  setResultStrOrError(pContext,z_00,iVar4,'\x01',xDel);
  return;
}

Assistant:

static void fts3OffsetsFunc(
  sqlite3_context *pContext,      /* SQLite function call context */
  int nVal,                       /* Size of argument array */
  sqlite3_value **apVal           /* Array of arguments */
){
  Fts3Cursor *pCsr;               /* Cursor handle passed through apVal[0] */

  UNUSED_PARAMETER(nVal);

  assert( nVal==1 );
  if( fts3FunctionArg(pContext, "offsets", apVal[0], &pCsr) ) return;
  assert( pCsr );
  if( SQLITE_OK==fts3CursorSeek(pContext, pCsr) ){
    sqlite3Fts3Offsets(pContext, pCsr);
  }
}